

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path,WriteMode mode)

{
  PathPtr path_00;
  undefined4 in_register_0000000c;
  File *extraout_RDX;
  WriteMode in_R8D;
  Maybe<kj::Own<const_kj::File>_> MVar1;
  Maybe<kj::AutoCloseFd> local_4c;
  Maybe<kj::Own<kj::File>_> local_40;
  String *pSStack_28;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (DiskHandle *)path.parts.size_;
  pSStack_28 = path.parts.ptr;
  path_00.parts.size_ = (size_t)path_local.parts.ptr;
  path_00.parts.ptr = (String *)this_local;
  path_local.parts.size_ = (size_t)this;
  tryOpenFileInternal(&local_4c,(DiskHandle *)pSStack_28,path_00,in_R8D,false);
  Maybe<kj::AutoCloseFd>::map<kj::Own<kj::File>_(&)(kj::AutoCloseFd)>
            ((Maybe<kj::AutoCloseFd> *)&local_40,(_func_Own<kj::File>_AutoCloseFd *)&local_4c);
  Maybe<kj::Own<const_kj::File>_>::Maybe<kj::File>
            ((Maybe<kj::Own<const_kj::File>_> *)this,&local_40);
  Maybe<kj::Own<kj::File>_>::~Maybe(&local_40);
  Maybe<kj::AutoCloseFd>::~Maybe(&local_4c);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const {
    return tryOpenFileInternal(path, mode, false).map(newDiskFile);
  }